

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,char *str,char *str_end)

{
  ImGuiContext_conflict1 *pIVar1;
  ImGuiID id;
  long lVar2;
  size_t data_size;
  
  lVar2 = (long)(this->IDStack).Size;
  if (0 < lVar2) {
    data_size = (long)str_end - (long)str;
    if (str_end == (char *)0x0) {
      data_size = 0;
    }
    id = ImHashStr(str,data_size,(this->IDStack).Data[lVar2 + -1]);
    pIVar1 = GImGui;
    if (GImGui->ActiveId == id) {
      GImGui->ActiveIdIsAlive = id;
    }
    if (pIVar1->ActiveIdPreviousFrame == id) {
      pIVar1->ActiveIdPreviousFrameIsAlive = true;
    }
    if (pIVar1->DebugHookIdInfo == id) {
      ImGui::DebugHookIdInfo(id,0xb,str,str_end);
    }
    return id;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                ,0x70f,"T &ImVector<unsigned int>::back() [T = unsigned int]");
}

Assistant:

const char* ImTextCharToUtf8(char out_buf[5], unsigned int c)
{
    int count = ImTextCharToUtf8_inline(out_buf, 5, c);
    out_buf[count] = 0;
    return out_buf;
}